

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                   string *validation_name,string *item_name,
                   vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   *objects_info,XrFaceExpression2FB value)

{
  bool bVar1;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_b8;
  allocator local_99;
  string local_98 [8];
  string error_str;
  allocator local_61;
  string local_60 [8];
  string vuid;
  XrFaceExpression2FB value_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *item_name_local;
  string *validation_name_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  if ((instance_info == (GenValidUsageXrInstanceInfo *)0x0) ||
     (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_FB_face_tracking2"), bVar1)) {
    switch(value) {
    case XR_FACE_EXPRESSION2_BROW_LOWERER_L_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_BROW_LOWERER_R_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_CHEEK_PUFF_L_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_CHEEK_PUFF_R_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_CHEEK_RAISER_L_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_CHEEK_RAISER_R_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_CHEEK_SUCK_L_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_CHEEK_SUCK_R_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_CHIN_RAISER_B_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_CHIN_RAISER_T_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_DIMPLER_L_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_DIMPLER_R_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_EYES_CLOSED_L_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_EYES_CLOSED_R_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_EYES_LOOK_DOWN_L_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_EYES_LOOK_DOWN_R_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_EYES_LOOK_LEFT_L_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_EYES_LOOK_LEFT_R_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_EYES_LOOK_RIGHT_L_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_EYES_LOOK_RIGHT_R_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_EYES_LOOK_UP_L_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_EYES_LOOK_UP_R_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_INNER_BROW_RAISER_L_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_INNER_BROW_RAISER_R_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_JAW_DROP_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_JAW_SIDEWAYS_LEFT_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_JAW_SIDEWAYS_RIGHT_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_JAW_THRUST_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LID_TIGHTENER_L_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LID_TIGHTENER_R_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LIP_CORNER_DEPRESSOR_L_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LIP_CORNER_DEPRESSOR_R_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LIP_CORNER_PULLER_L_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LIP_CORNER_PULLER_R_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LIP_FUNNELER_LB_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LIP_FUNNELER_LT_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LIP_FUNNELER_RB_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LIP_FUNNELER_RT_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LIP_PRESSOR_L_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LIP_PRESSOR_R_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LIP_PUCKER_L_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LIP_PUCKER_R_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LIP_STRETCHER_L_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LIP_STRETCHER_R_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LIP_SUCK_LB_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LIP_SUCK_LT_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LIP_SUCK_RB_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LIP_SUCK_RT_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LIP_TIGHTENER_L_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LIP_TIGHTENER_R_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LIPS_TOWARD_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LOWER_LIP_DEPRESSOR_L_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_LOWER_LIP_DEPRESSOR_R_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_MOUTH_LEFT_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_MOUTH_RIGHT_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_NOSE_WRINKLER_L_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_NOSE_WRINKLER_R_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_OUTER_BROW_RAISER_L_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_OUTER_BROW_RAISER_R_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_UPPER_LID_RAISER_L_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_UPPER_LID_RAISER_R_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_UPPER_LIP_RAISER_L_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_UPPER_LIP_RAISER_R_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_TONGUE_TIP_INTERDENTAL_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_TONGUE_TIP_ALVEOLAR_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_TONGUE_FRONT_DORSAL_PALATE_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_TONGUE_MID_DORSAL_PALATE_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_TONGUE_BACK_DORSAL_VELAR_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_TONGUE_OUT_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_TONGUE_RETREAT_FB:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACE_EXPRESSION2_COUNT_FB:
      instance_info_local._7_1_ = true;
      break;
    default:
      instance_info_local._7_1_ = false;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"VUID-",&local_61);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    std::__cxx11::string::operator+=(local_60,(string *)validation_name);
    std::__cxx11::string::operator+=(local_60,"-");
    std::__cxx11::string::operator+=(local_60,(string *)item_name);
    std::__cxx11::string::operator+=(local_60,"-parameter");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"XrFaceExpression2FB requires extension ",&local_99);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::__cxx11::string::operator+=
              (local_98," \"XR_FB_face_tracking2\" to be enabled, but it is not enabled");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_b8,objects_info);
    CoreValidLogMessage(instance_info,(string *)local_60,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                        command_name,&local_b8,(string *)local_98);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_b8);
    instance_info_local._7_1_ = false;
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_60);
  }
  return instance_info_local._7_1_;
}

Assistant:

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,
                    const std::string &command_name,
                    const std::string &validation_name,
                    const std::string &item_name,
                    std::vector<GenValidUsageXrObjectInfo>& objects_info,
                    const XrFaceExpression2FB value) {
    (void)instance_info;  // quiet warnings
    (void)command_name;  // quiet warnings
    (void)validation_name;  // quiet warnings
    (void)item_name;  // quiet warnings
    (void)objects_info;  // quiet warnings
    // Enum requires extension XR_FB_face_tracking2, so check that it is enabled
    if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_FB_face_tracking2")) {
        std::string vuid = "VUID-";
        vuid += validation_name;
        vuid += "-";
        vuid += item_name;
        vuid += "-parameter";
        std::string error_str = "XrFaceExpression2FB requires extension ";
        error_str += " \"XR_FB_face_tracking2\" to be enabled, but it is not enabled";
        CoreValidLogMessage(instance_info, vuid,
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, error_str);
        return false;
    }
    switch (value) {
        case XR_FACE_EXPRESSION2_BROW_LOWERER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_BROW_LOWERER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_CHEEK_PUFF_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_CHEEK_PUFF_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_CHEEK_RAISER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_CHEEK_RAISER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_CHEEK_SUCK_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_CHEEK_SUCK_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_CHIN_RAISER_B_FB:
            return true;
        case XR_FACE_EXPRESSION2_CHIN_RAISER_T_FB:
            return true;
        case XR_FACE_EXPRESSION2_DIMPLER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_DIMPLER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_EYES_CLOSED_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_EYES_CLOSED_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_EYES_LOOK_DOWN_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_EYES_LOOK_DOWN_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_EYES_LOOK_LEFT_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_EYES_LOOK_LEFT_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_EYES_LOOK_RIGHT_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_EYES_LOOK_RIGHT_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_EYES_LOOK_UP_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_EYES_LOOK_UP_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_INNER_BROW_RAISER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_INNER_BROW_RAISER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_JAW_DROP_FB:
            return true;
        case XR_FACE_EXPRESSION2_JAW_SIDEWAYS_LEFT_FB:
            return true;
        case XR_FACE_EXPRESSION2_JAW_SIDEWAYS_RIGHT_FB:
            return true;
        case XR_FACE_EXPRESSION2_JAW_THRUST_FB:
            return true;
        case XR_FACE_EXPRESSION2_LID_TIGHTENER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_LID_TIGHTENER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_CORNER_DEPRESSOR_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_CORNER_DEPRESSOR_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_CORNER_PULLER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_CORNER_PULLER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_FUNNELER_LB_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_FUNNELER_LT_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_FUNNELER_RB_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_FUNNELER_RT_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_PRESSOR_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_PRESSOR_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_PUCKER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_PUCKER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_STRETCHER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_STRETCHER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_SUCK_LB_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_SUCK_LT_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_SUCK_RB_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_SUCK_RT_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_TIGHTENER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_TIGHTENER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIPS_TOWARD_FB:
            return true;
        case XR_FACE_EXPRESSION2_LOWER_LIP_DEPRESSOR_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_LOWER_LIP_DEPRESSOR_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_MOUTH_LEFT_FB:
            return true;
        case XR_FACE_EXPRESSION2_MOUTH_RIGHT_FB:
            return true;
        case XR_FACE_EXPRESSION2_NOSE_WRINKLER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_NOSE_WRINKLER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_OUTER_BROW_RAISER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_OUTER_BROW_RAISER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_UPPER_LID_RAISER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_UPPER_LID_RAISER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_UPPER_LIP_RAISER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_UPPER_LIP_RAISER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_TONGUE_TIP_INTERDENTAL_FB:
            return true;
        case XR_FACE_EXPRESSION2_TONGUE_TIP_ALVEOLAR_FB:
            return true;
        case XR_FACE_EXPRESSION2_TONGUE_FRONT_DORSAL_PALATE_FB:
            return true;
        case XR_FACE_EXPRESSION2_TONGUE_MID_DORSAL_PALATE_FB:
            return true;
        case XR_FACE_EXPRESSION2_TONGUE_BACK_DORSAL_VELAR_FB:
            return true;
        case XR_FACE_EXPRESSION2_TONGUE_OUT_FB:
            return true;
        case XR_FACE_EXPRESSION2_TONGUE_RETREAT_FB:
            return true;
        case XR_FACE_EXPRESSION2_COUNT_FB:
            return true;
    default:
        return false;
}
}